

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O2

SeatPromptResult * console_get_userpass_input(SeatPromptResult *__return_storage_ptr__,prompts_t *p)

{
  prompt_t *ppVar1;
  size_t sVar2;
  bool bVar3;
  _Bool _Var4;
  int __fd;
  uint uVar5;
  void *__buf;
  ssize_t sVar6;
  int *piVar7;
  wchar_t i;
  ulong uVar8;
  int __fd_00;
  char *pcVar9;
  ptrlen data;
  ptrlen data_00;
  ptrlen pVar10;
  ptrlen suffix;
  ptrlen suffix_00;
  FILE *local_b8;
  termios local_a8;
  termios oldmode;
  
  for (uVar8 = 0; uVar8 < p->n_prompts; uVar8 = uVar8 + 1) {
    prompt_set_result(p->prompts[uVar8],"");
  }
  if ((p->n_prompts == 0) || (console_batch_mode != true)) {
    __fd_00 = 0;
    pcVar9 = (char *)0x2;
    __fd = open("/dev/tty",2);
    if (__fd < 0) {
      local_b8 = _stderr;
    }
    else {
      pcVar9 = "w";
      local_b8 = fdopen(__fd,"w");
      __fd_00 = __fd;
    }
    if ((p->name_reqd == true) && (p->name != (char *)0x0)) {
      pVar10 = ptrlen_from_asciz(p->name);
      pcVar9 = (char *)pVar10.len;
      console_write((FILE *)local_b8,pVar10);
      suffix.len = 1;
      suffix.ptr = "\n";
      _Var4 = ptrlen_endswith(pVar10,suffix,(ptrlen *)0x0);
      if (!_Var4) {
        pVar10.len = 1;
        pVar10.ptr = "\n";
        pcVar9 = "\n";
        console_write((FILE *)local_b8,pVar10);
      }
    }
    if (p->instruction != (char *)0x0) {
      pVar10 = ptrlen_from_asciz(p->instruction);
      pcVar9 = (char *)pVar10.len;
      console_write((FILE *)local_b8,pVar10);
      suffix_00.len = 1;
      suffix_00.ptr = "\n";
      _Var4 = ptrlen_endswith(pVar10,suffix_00,(ptrlen *)0x0);
      if (!_Var4) {
        data.len = 1;
        data.ptr = "\n";
        pcVar9 = "\n";
        console_write((FILE *)local_b8,data);
      }
    }
    for (uVar8 = 0; uVar8 < p->n_prompts; uVar8 = uVar8 + 1) {
      ppVar1 = p->prompts[uVar8];
      tcgetattr(__fd_00,(termios *)&oldmode);
      local_a8.c_iflag = oldmode.c_iflag;
      local_a8.c_oflag = oldmode.c_oflag;
      local_a8.c_line = oldmode.c_line;
      local_a8.c_cc[0] = oldmode.c_cc[0];
      local_a8.c_cc[1] = oldmode.c_cc[1];
      local_a8.c_cc[2] = oldmode.c_cc[2];
      local_a8.c_cc[3] = oldmode.c_cc[3];
      local_a8.c_cc[4] = oldmode.c_cc[4];
      local_a8.c_cc[5] = oldmode.c_cc[5];
      local_a8.c_cc[6] = oldmode.c_cc[6];
      local_a8.c_cc[7] = oldmode.c_cc[7];
      local_a8.c_cc[8] = oldmode.c_cc[8];
      local_a8.c_cc[9] = oldmode.c_cc[9];
      local_a8.c_cc[10] = oldmode.c_cc[10];
      local_a8.c_cc[0xb] = oldmode.c_cc[0xb];
      local_a8.c_cc[0xc] = oldmode.c_cc[0xc];
      local_a8.c_cc[0xd] = oldmode.c_cc[0xd];
      local_a8.c_cc[0xe] = oldmode.c_cc[0xe];
      local_a8.c_cc[0xf] = oldmode.c_cc[0xf];
      local_a8.c_cc[0x10] = oldmode.c_cc[0x10];
      local_a8.c_cc[0x11] = oldmode.c_cc[0x11];
      local_a8.c_cc[0x12] = oldmode.c_cc[0x12];
      local_a8.c_cc[0x13] = oldmode.c_cc[0x13];
      local_a8.c_cc[0x14] = oldmode.c_cc[0x14];
      local_a8.c_cc[0x15] = oldmode.c_cc[0x15];
      local_a8.c_cc[0x16] = oldmode.c_cc[0x16];
      local_a8.c_ispeed = oldmode.c_ispeed;
      local_a8.c_ospeed = oldmode.c_ospeed;
      local_a8.c_lflag = oldmode.c_lflag;
      uVar5 = local_a8.c_lflag | 0xb;
      if (ppVar1->echo == false) {
        uVar5 = local_a8.c_lflag & 0xfffffff4 | 3;
      }
      local_a8.c_cflag = oldmode.c_cflag;
      local_a8.c_lflag = uVar5;
      tcsetattr(__fd_00,0,(termios *)&local_a8);
      pVar10 = ptrlen_from_asciz(ppVar1->prompt);
      console_write((FILE *)local_b8,pVar10);
      do {
        sVar2 = ppVar1->result->len;
        __buf = strbuf_append(ppVar1->result,0x10000);
        sVar6 = read(__fd_00,__buf,0x10000);
        uVar5 = (uint)sVar6;
        if (uVar5 == 0) {
          __return_storage_ptr__->kind = SPRK_USER_ABORT;
          __return_storage_ptr__->errdata_lit = (char *)0x0;
LAB_00118eb0:
          bVar3 = true;
          goto LAB_00118eb3;
        }
        if ((int)uVar5 < 0) {
          piVar7 = __errno_location();
          make_spr_sw_abort_errno(__return_storage_ptr__,"Error reading from terminal",*piVar7);
          goto LAB_00118eb0;
        }
        strbuf_shrink_to(ppVar1->result,(uVar5 & 0x7fffffff) + sVar2);
        _Var4 = strbuf_chomp(ppVar1->result,'\n');
      } while (!_Var4);
      bVar3 = false;
LAB_00118eb3:
      pcVar9 = (char *)0x0;
      tcsetattr(__fd_00,0,(termios *)&oldmode);
      if (ppVar1->echo == false) {
        data_00.len = 1;
        data_00.ptr = "\n";
        pcVar9 = "\n";
        console_write((FILE *)local_b8,data_00);
      }
      if (bVar3) {
        console_close((FILE *)local_b8,(wchar_t)pcVar9);
        return __return_storage_ptr__;
      }
    }
    console_close((FILE *)local_b8,(wchar_t)pcVar9);
    __return_storage_ptr__->kind = SPRK_OK;
    __return_storage_ptr__->errdata_lit = (char *)0x0;
  }
  else {
    make_spr_sw_abort_static
              (__return_storage_ptr__,"Cannot answer interactive prompts in batch mode");
  }
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult console_get_userpass_input(prompts_t *p)
{
    size_t curr_prompt;
    FILE *outfp = NULL;
    int infd;

    /*
     * Zero all the results, in case we abort half-way through.
     */
    {
        int i;
        for (i = 0; i < p->n_prompts; i++)
            prompt_set_result(p->prompts[i], "");
    }

    if (p->n_prompts && console_batch_mode)
        return SPR_SW_ABORT("Cannot answer interactive prompts "
                            "in batch mode");

    console_open(&outfp, &infd);

    /*
     * Preamble.
     */
    /* We only print the `name' caption if we have to... */
    if (p->name_reqd && p->name) {
        ptrlen plname = ptrlen_from_asciz(p->name);
        console_write(outfp, plname);
        if (!ptrlen_endswith(plname, PTRLEN_LITERAL("\n"), NULL))
            console_write(outfp, PTRLEN_LITERAL("\n"));
    }
    /* ...but we always print any `instruction'. */
    if (p->instruction) {
        ptrlen plinst = ptrlen_from_asciz(p->instruction);
        console_write(outfp, plinst);
        if (!ptrlen_endswith(plinst, PTRLEN_LITERAL("\n"), NULL))
            console_write(outfp, PTRLEN_LITERAL("\n"));
    }

    for (curr_prompt = 0; curr_prompt < p->n_prompts; curr_prompt++) {

        struct termios oldmode, newmode;
        prompt_t *pr = p->prompts[curr_prompt];

        tcgetattr(infd, &oldmode);
        newmode = oldmode;
        newmode.c_lflag |= ISIG | ICANON;
        if (!pr->echo)
            newmode.c_lflag &= ~ECHO;
        else
            newmode.c_lflag |= ECHO;
        tcsetattr(infd, TCSANOW, &newmode);

        console_write(outfp, ptrlen_from_asciz(pr->prompt));

        bool failed = false;
        SeatPromptResult spr;
        while (1) {
            size_t toread = 65536;
            size_t prev_result_len = pr->result->len;
            void *ptr = strbuf_append(pr->result, toread);
            int ret = read(infd, ptr, toread);

            if (ret == 0) {
                /* Regard EOF on the terminal as a deliberate user-abort */
                failed = true;
                spr = SPR_USER_ABORT;
                break;
            }

            if (ret < 0) {
                /* Any other failure to read from the terminal is treated as
                 * an unexpected error and reported to the user. */
                failed = true;
                spr = make_spr_sw_abort_errno(
                    "Error reading from terminal", errno);
                break;
            }

            strbuf_shrink_to(pr->result, prev_result_len + ret);
            if (strbuf_chomp(pr->result, '\n'))
                break;
        }

        tcsetattr(infd, TCSANOW, &oldmode);

        if (!pr->echo)
            console_write(outfp, PTRLEN_LITERAL("\n"));

        if (failed) {
            console_close(outfp, infd);
            return spr;
        }
    }

    console_close(outfp, infd);

    return SPR_OK;
}